

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

void Abc_FrameMiniAigSetCiArrivals(Abc_Frame_t *pAbc,int *pArrivals)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Vec_Int_t *pVVar3;
  int *__dest;
  char *__s;
  
  if (pArrivals == (int *)0x0) {
    __s = "Arrival times are not given.";
  }
  else if (pAbc == (Abc_Frame_t *)0x0) {
    __s = "ABC framework is not initialized by calling Abc_Start().";
  }
  else {
    pGVar2 = Abc_FrameReadGia(pAbc);
    if (pGVar2 != (Gia_Man_t *)0x0) {
      pVVar3 = pGVar2->vCiArrs;
      if (pVVar3 != (Vec_Int_t *)0x0) {
        if (pVVar3->pArray != (int *)0x0) {
          free(pVVar3->pArray);
          pGVar2->vCiArrs->pArray = (int *)0x0;
          pVVar3 = pGVar2->vCiArrs;
          if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_002147ad;
        }
        free(pVVar3);
        pGVar2->vCiArrs = (Vec_Int_t *)0x0;
      }
LAB_002147ad:
      iVar1 = pGVar2->vCis->nSize;
      pVVar3 = (Vec_Int_t *)malloc(0x10);
      pVVar3->nSize = iVar1;
      pVVar3->nCap = iVar1;
      __dest = (int *)malloc((long)iVar1 << 2);
      pVVar3->pArray = __dest;
      memcpy(__dest,pArrivals,(long)iVar1 << 2);
      pGVar2->vCiArrs = pVVar3;
      return;
    }
    __s = "Current network in ABC framework is not defined.";
  }
  puts(__s);
  return;
}

Assistant:

void Abc_FrameMiniAigSetCiArrivals( Abc_Frame_t * pAbc, int * pArrivals )
{
    Gia_Man_t * pGia;
    if ( pArrivals == NULL )
        { printf( "Arrival times are not given.\n" ); return; }
    if ( pAbc == NULL )
        { printf( "ABC framework is not initialized by calling Abc_Start().\n" ); return; }
    pGia = Abc_FrameReadGia( pAbc );
    if ( pGia == NULL )
        { printf( "Current network in ABC framework is not defined.\n" ); return; }
    Vec_IntFreeP( &pGia->vCiArrs );
    pGia->vCiArrs = Vec_IntAllocArrayCopy( pArrivals, Gia_ManCiNum(pGia) );
}